

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void mp::
     WriteAlgCon<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::MutAlgebraicCon,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
               (Writer *w,MutAlgebraicCon *con,VarNamer vnam)

{
  double value;
  long lVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ExprBase nonlinear;
  ulong uVar6;
  Buffer<char> *pBVar7;
  size_t sVar8;
  double value_00;
  FormatSpec local_48;
  
  lVar1 = (long)(((con->
                  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
                 )->algebraic_cons_).
                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(con->
                super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ *
          0x88;
  value = *(double *)(lVar1 + 0x78 + lVar5);
  value_00 = *(double *)(lVar1 + 0x80 + lVar5);
  if ((value_00 < INFINITY) && (-INFINITY < value)) {
    if ((value != value_00) || (NAN(value) || NAN(value_00))) {
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(w,value,&local_48);
      pBVar7 = w->buffer_;
      uVar6 = pBVar7->size_ + 4;
      if (pBVar7->capacity_ < uVar6) {
        (**pBVar7->_vptr_Buffer)(pBVar7,uVar6);
      }
      builtin_strncpy(pBVar7->ptr_ + pBVar7->size_," <= ",4);
      pBVar7->size_ = uVar6;
    }
  }
  pBVar2 = (con->
           super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  uVar6 = (ulong)(con->
                 super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  lVar1 = (long)(pBVar2->nonlinear_cons_).
                super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(pBVar2->nonlinear_cons_).
                            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - lVar1 >> 3)) {
    nonlinear.impl_ = *(Impl **)(lVar1 + uVar6 * 8);
  }
  else {
    nonlinear.impl_ = (Impl *)0x0;
  }
  WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
            (w,(LinearExpr *)
               (uVar6 * 0x88 +
               (long)(pBVar2->algebraic_cons_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)nonlinear.impl_,vnam);
  if ((value != value_00) || (NAN(value) || NAN(value_00))) {
    if (value_00 < INFINITY) {
      pBVar7 = w->buffer_;
      uVar6 = pBVar7->size_ + 4;
      if (pBVar7->capacity_ < uVar6) {
        (**pBVar7->_vptr_Buffer)(pBVar7,uVar6);
      }
      builtin_strncpy(pBVar7->ptr_ + pBVar7->size_," <= ",4);
      pBVar7->size_ = uVar6;
      goto LAB_0033543f;
    }
    if (value <= -INFINITY) {
      return;
    }
    pBVar7 = w->buffer_;
    sVar8 = pBVar7->size_ + 4;
    if (pBVar7->capacity_ < sVar8) {
      (**pBVar7->_vptr_Buffer)(pBVar7,sVar8);
    }
    builtin_strncpy(pBVar7->ptr_ + pBVar7->size_," >= ",4);
  }
  else {
    pBVar7 = w->buffer_;
    sVar8 = pBVar7->size_ + 3;
    if (pBVar7->capacity_ < sVar8) {
      (**pBVar7->_vptr_Buffer)(pBVar7,sVar8);
    }
    pcVar3 = pBVar7->ptr_;
    sVar4 = pBVar7->size_;
    pcVar3[sVar4 + 2] = ' ';
    pcVar3 = pcVar3 + sVar4;
    pcVar3[0] = ' ';
    pcVar3[1] = '=';
  }
  pBVar7->size_ = sVar8;
  value_00 = value;
LAB_0033543f:
  local_48.type_ = '\0';
  local_48.precision_ = -1;
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  fmt::BasicWriter<char>::write_double<double>(w,value_00,&local_48);
  return;
}

Assistant:

void WriteAlgCon(fmt::Writer &w,
                 const AlgCon &con, VN vnam) {
  double inf = INFINITY;
  double lb = con.lb(), ub = con.ub();
  if (lb != ub && lb != -inf && ub != inf)
    w << lb << " <= ";
  WriteExpr<ExprTypes>(
        w, con.linear_expr(), con.nonlinear_expr(), vnam);
  if (lb == ub)
    w << " = " << lb;
  else if (ub != inf)
    w << " <= " << ub;
  else if (lb != -inf)
    w << " >= " << lb;
}